

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_verify_cigars.c
# Opt level: O0

void k_combination2(unsigned_long pos,unsigned_long *a,unsigned_long *b)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar7;
  undefined8 local_30;
  double i;
  double s;
  unsigned_long *b_local;
  unsigned_long *a_local;
  unsigned_long pos_local;
  undefined1 auVar6 [16];
  
  uVar7 = (undefined4)(pos >> 0x20);
  auVar6._8_4_ = uVar7;
  auVar6._0_8_ = pos;
  auVar6._12_4_ = 0x45300000;
  uVar5 = (undefined4)pos;
  dVar2 = sqrt(((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0)) * 2.0);
  local_30 = floor(dVar2);
  local_30 = local_30 - 1.0;
  if (local_30 <= 1.0) {
    local_30 = 1.0;
  }
  i = (local_30 * (local_30 - 1.0)) / 2.0;
  for (; auVar3._8_4_ = uVar7, auVar3._0_8_ = pos, auVar3._12_4_ = 0x45300000,
      local_30 <=
      ((auVar3._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0)) - i; local_30 = local_30 + 1.0) {
    i = local_30 + i;
  }
  auVar4._8_4_ = uVar7;
  auVar4._0_8_ = pos;
  auVar4._12_4_ = 0x45300000;
  dVar2 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0)) - i;
  uVar1 = (ulong)dVar2;
  *a = uVar1 | (long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f;
  *b = (long)local_30 | (long)(local_30 - 9.223372036854776e+18) & (long)local_30 >> 0x3f;
  return;
}

Assistant:

static inline void k_combination2(
        unsigned long pos,
        unsigned long *a,
        unsigned long *b)
{
    double s;
    double i = floor(sqrt(2.0 * pos)) - 1.0;
    if (i <= 1.0) {
        i = 1.0;
    }
    s = i * (i - 1.0) / 2.0;
    while (pos - s >= i) {
        s += i;
        i += 1;
    }
    *a = (unsigned long)(pos - s);
    *b = (unsigned long)(i);
}